

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O1

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context *pk)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  mbedtls_pk_info_t *info;
  mbedtls_rsa_context *rsa;
  void *in_R8;
  uchar *end_00;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  mbedtls_asn1_buf alg_params;
  mbedtls_pk_type_t local_54;
  size_t local_50;
  mbedtls_pk_context local_48;
  mbedtls_asn1_buf local_38;
  
  local_54 = MBEDTLS_PK_NONE;
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_50,0x30);
  if (iVar1 == 0) {
    end_00 = *p + local_50;
    iVar1 = pk_get_pk_alg(p,end_00,&local_54,&local_38,in_R8);
    if (iVar1 == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null(p,end_00,&local_50);
      if (iVar1 == 0) {
        iVar1 = -0x3b66;
        if (*p + local_50 == end_00) {
          info = mbedtls_pk_info_from_type(local_54);
          if (info == (mbedtls_pk_info_t *)0x0) {
            iVar1 = -0x3c80;
          }
          else {
            iVar1 = mbedtls_pk_setup(pk,info);
            if (iVar1 == 0) {
              iVar1 = -0x3c80;
              if (local_54 == MBEDTLS_PK_RSA) {
                local_48.pk_info = pk->pk_info;
                local_48.pk_ctx = pk->pk_ctx;
                mVar2 = mbedtls_pk_get_type(&local_48);
                rsa = (mbedtls_rsa_context *)local_48.pk_ctx;
                if (mVar2 != MBEDTLS_PK_RSA) {
                  rsa = (mbedtls_rsa_context *)0x0;
                }
                iVar3 = mbedtls_rsa_parse_pubkey(rsa,*p,(long)end_00 - (long)*p);
                if (iVar3 == 0) {
                  *p = end_00;
                  iVar1 = 0;
                }
                else {
                  iVar1 = iVar3 + -0x3b00;
                  if (0xc < iVar3 + 0x6cU) {
                    iVar1 = -0x3b00;
                  }
                }
              }
              if (iVar1 == 0) {
                iVar1 = -0x3b66;
                if (*p == end_00) {
                  iVar1 = 0;
                }
              }
              if (iVar1 != 0) {
                mbedtls_pk_free(pk);
              }
            }
          }
        }
      }
      else {
        iVar1 = iVar1 + -0x3b00;
      }
    }
  }
  else {
    iVar1 = iVar1 + -0x3d00;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_subpubkey(unsigned char **p, const unsigned char *end,
                               mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    int ec_grp_id = 0;
    const mbedtls_pk_info_t *pk_info;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = *p + len;

    if ((ret = pk_get_pk_alg(p, end, &pk_alg, &alg_params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_bitstring_null(p, end, &len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*pk), *p, (size_t) (end - *p));
        if (ret == 0) {
            /* On success all the input has been consumed by the parsing function. */
            *p += end - *p;
        } else if ((ret <= MBEDTLS_ERR_ASN1_OUT_OF_DATA) &&
                   (ret >= MBEDTLS_ERR_ASN1_BUF_TOO_SMALL)) {
            /* In case of ASN1 error codes add MBEDTLS_ERR_PK_INVALID_PUBKEY. */
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
        } else {
            ret = MBEDTLS_ERR_PK_INVALID_PUBKEY;
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            ret = pk_use_ecparams_rfc8410(&alg_params, ec_grp_id, pk);
        } else
#endif
        {
            ret = pk_use_ecparams(&alg_params, pk);
        }
        if (ret == 0) {
            ret = mbedtls_pk_ecc_set_pubkey(pk, *p, (size_t) (end - *p));
            *p += end - *p;
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if (ret == 0 && *p != end) {
        ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if (ret != 0) {
        mbedtls_pk_free(pk);
    }

    return ret;
}